

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O3

void __thiscall
Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage
          (D3MFOpcPackage *this,IOSystem *pIOHandler,string *rFile)

{
  ZipArchiveIOSystem *pZVar1;
  size_t __n;
  pointer __s1;
  D3MFOpcPackage *pDVar2;
  pointer pbVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  ZipArchiveIOSystem *this_00;
  Logger *pLVar7;
  IOStream *pIVar8;
  runtime_error *this_01;
  long *plVar9;
  size_type *psVar10;
  D3MFOpcPackage *this_02;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileList;
  string rootFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  D3MFOpcPackage *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this->mRootStream = (IOStream *)0x0;
  (this->mZipArchive)._M_t.
  super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl =
       (ZipArchiveIOSystem *)0x0;
  local_1d0 = this;
  this_00 = (ZipArchiveIOSystem *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
  ZipArchiveIOSystem::ZipArchiveIOSystem(this_00,pIOHandler,rFile,"r");
  pZVar1 = (this->mZipArchive)._M_t.
           super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
  (this->mZipArchive)._M_t.
  super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl = this_00;
  if (pZVar1 != (ZipArchiveIOSystem *)0x0) {
    (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 8))();
    this_00 = (this->mZipArchive)._M_t.
              super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
              .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
  }
  bVar4 = ZipArchiveIOSystem::isOpen(this_00);
  if (!bVar4) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1f0,"Failed to open file ",rFile);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_1a8[0]._M_dataplus._M_p == psVar10) {
      local_1a8[0].field_2._0_8_ = *psVar10;
      local_1a8[0].field_2._8_8_ = plVar9[3];
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    }
    else {
      local_1a8[0].field_2._0_8_ = *psVar10;
    }
    local_1a8[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::runtime_error::runtime_error(this_01,(string *)local_1a8);
    *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ZipArchiveIOSystem::getFileList
            ((this->mZipArchive)._M_t.
             super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
             .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl,&local_1c8);
  pbVar3 = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar11 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      __n = pbVar11->_M_string_length;
      if (__n == DAT_008df630) {
        __s1 = (pbVar11->_M_dataplus)._M_p;
        if (__n != 0) {
          iVar6 = bcmp(__s1,XmlTag::ROOT_RELATIONSHIPS_ARCHIVE_abi_cxx11_,__n);
          if (iVar6 != 0) goto LAB_0065accd;
        }
        pZVar1 = (local_1d0->mZipArchive)._M_t.
                 super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
        cVar5 = (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 0x10))(pZVar1,__s1);
        pDVar2 = local_1d0;
        if (cVar5 == '\0') {
          __assert_fail("mZipArchive->Exists(file.c_str())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3MF/D3MFOpcPackage.cpp"
                        ,0x87,
                        "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                       );
        }
        pZVar1 = (local_1d0->mZipArchive)._M_t.
                 super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
        this_02 = (D3MFOpcPackage *)(pbVar11->_M_dataplus)._M_p;
        pIVar8 = (IOStream *)
                 (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 0x20))
                           (pZVar1,this_02,"rb");
        if (pIVar8 == (IOStream *)0x0) {
          __assert_fail("fileStream != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3MF/D3MFOpcPackage.cpp"
                        ,0x8b,
                        "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                       );
        }
        ReadPackageRootRelationship_abi_cxx11_(local_1a8,this_02,pIVar8);
        if ((local_1a8[0]._M_string_length != 0) && (*local_1a8[0]._M_dataplus._M_p == '/')) {
          std::__cxx11::string::substr((ulong)&local_1f0,(ulong)local_1a8);
          std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if (*local_1a8[0]._M_dataplus._M_p == '/') {
            std::__cxx11::string::substr((ulong)&local_1f0,(ulong)local_1a8);
            std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        pLVar7 = DefaultLogger::get();
        Logger::debug(pLVar7,local_1a8[0]._M_dataplus._M_p);
        pZVar1 = (pDVar2->mZipArchive)._M_t.
                 super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
        (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 0x28))(pZVar1,pIVar8);
        pZVar1 = (pDVar2->mZipArchive)._M_t.
                 super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
        pIVar8 = (IOStream *)
                 (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 0x20))
                           (pZVar1,local_1a8[0]._M_dataplus._M_p,"rb");
        pDVar2->mRootStream = pIVar8;
        if (pIVar8 == (IOStream *)0x0) {
          __assert_fail("mRootStream != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3MF/D3MFOpcPackage.cpp"
                        ,0x9b,
                        "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                       );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_0065accd:
        if (__n == DAT_008df610) {
          if (__n != 0) {
            iVar6 = bcmp((pbVar11->_M_dataplus)._M_p,XmlTag::CONTENT_TYPES_ARCHIVE_abi_cxx11_,__n);
            if (iVar6 != 0) goto LAB_0065acf9;
          }
          pLVar7 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"Ignored file of unsupported type CONTENT_TYPES_ARCHIVES");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar7,local_1f0._M_dataplus._M_p);
        }
        else {
LAB_0065acf9:
          pLVar7 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[31]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,(char (*) [31])"Ignored file of unknown type: ");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar7,local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  return;
}

Assistant:

D3MFOpcPackage::D3MFOpcPackage(IOSystem* pIOHandler, const std::string& rFile)
: mRootStream(nullptr)
, mZipArchive() {    
    mZipArchive.reset( new ZipArchiveIOSystem( pIOHandler, rFile ) );
    if(!mZipArchive->isOpen()) {
        throw DeadlyImportError("Failed to open file " + rFile+ ".");
    }

    std::vector<std::string> fileList;
    mZipArchive->getFileList(fileList);

    for (auto& file: fileList) {
        if(file == D3MF::XmlTag::ROOT_RELATIONSHIPS_ARCHIVE) {
            //PkgRelationshipReader pkgRelReader(file, archive);
            ai_assert(mZipArchive->Exists(file.c_str()));

            IOStream *fileStream = mZipArchive->Open(file.c_str());

            ai_assert(fileStream != nullptr);

            std::string rootFile = ReadPackageRootRelationship(fileStream);
            if ( rootFile.size() > 0 && rootFile[ 0 ] == '/' ) {
                rootFile = rootFile.substr( 1 );
                if ( rootFile[ 0 ] == '/' ) {
                    // deal with zip-bug
                    rootFile = rootFile.substr( 1 );
                }
            }

            ASSIMP_LOG_DEBUG(rootFile);

            mZipArchive->Close(fileStream);

            mRootStream = mZipArchive->Open(rootFile.c_str());
            ai_assert( mRootStream != nullptr );
            if ( nullptr == mRootStream ) {
                throw DeadlyExportError( "Cannot open root-file in archive : " + rootFile );
            }

        } else if( file == D3MF::XmlTag::CONTENT_TYPES_ARCHIVE) {
            ASSIMP_LOG_WARN_F("Ignored file of unsupported type CONTENT_TYPES_ARCHIVES",file);
        } else {
            ASSIMP_LOG_WARN_F("Ignored file of unknown type: ",file);
        }

    }
}